

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  string *psVar5;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') {
    matching_name_abi_cxx11_();
  }
  psVar4 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + psVar4->_M_string_length);
      bVar3 = check_sname(other,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        return psVar4;
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  psVar4 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + psVar4->_M_string_length);
      bVar3 = check_lname(other,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        return psVar4;
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  if (((this->super_OptionBase<CLI::Option>).ignore_case_ == false) &&
     ((this->super_OptionBase<CLI::Option>).ignore_underscore_ != true)) {
    psVar5 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
  }
  else {
    psVar4 = (other->snames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (other->snames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      do {
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + psVar4->_M_string_length);
        bVar3 = check_sname(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          return psVar4;
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar1);
    }
    psVar4 = (other->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (other->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
    if (psVar4 != psVar1) {
      do {
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + psVar4->_M_string_length);
        bVar3 = check_lname(this,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        psVar5 = psVar4;
      } while ((!bVar3) &&
              (psVar4 = psVar4 + 1,
              psVar5 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,
              psVar4 != psVar1));
    }
  }
  return psVar5;
}

Assistant:

const std::string &matching_name(const Option &other) const {
        static const std::string estring;
        for(const std::string &sname : snames_)
            if(other.check_sname(sname))
                return sname;
        for(const std::string &lname : lnames_)
            if(other.check_lname(lname))
                return lname;

        if(ignore_case_ ||
           ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
            for(const std::string &sname : other.snames_)
                if(check_sname(sname))
                    return sname;
            for(const std::string &lname : other.lnames_)
                if(check_lname(lname))
                    return lname;
        }
        return estring;
    }